

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.cpp
# Opt level: O2

void __thiscall
TasGrid::DynamicConstructorDataGlobal::write<true>(DynamicConstructorDataGlobal *this,ostream *os)

{
  TensorData *pTVar1;
  pointer ppTVar2;
  vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_> tensor_refs;
  _Vector_base<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_> local_40;
  
  makeReverseReferenceVector<TasGrid::TensorData>
            ((vector<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_> *)
             &local_40,&this->tensors);
  IO::writeNumbers<true,(TasGrid::IO::IOPad)3,int>
            (os,(int)((ulong)((long)local_40._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_40._M_impl.super__Vector_impl_data._M_start) >> 3));
  for (ppTVar2 = local_40._M_impl.super__Vector_impl_data._M_start;
      ppTVar2 != local_40._M_impl.super__Vector_impl_data._M_finish; ppTVar2 = ppTVar2 + 1) {
    pTVar1 = *ppTVar2;
    IO::writeNumbers<true,(TasGrid::IO::IOPad)1,double>(os,pTVar1->weight);
    IO::writeVector<true,(TasGrid::IO::IOPad)3,int>(&pTVar1->tensor,os);
  }
  writeNodeDataList<true>(&this->data,os);
  ::std::_Vector_base<const_TasGrid::TensorData_*,_std::allocator<const_TasGrid::TensorData_*>_>::
  ~_Vector_base(&local_40);
  return;
}

Assistant:

void DynamicConstructorDataGlobal::write(std::ostream &os) const{
    if (use_ascii == mode_ascii){ os << std::scientific; os.precision(17); }
    auto tensor_refs =  makeReverseReferenceVector(tensors);

    IO::writeNumbers<use_ascii, IO::pad_line, int>(os, static_cast<int>(tensor_refs.size()));
    for(auto d : tensor_refs){
        IO::writeNumbers<use_ascii, IO::pad_rspace, double>(os, d->weight);
        IO::writeVector<use_ascii, IO::pad_line>(d->tensor, os);
    }
    writeNodeDataList<use_ascii>(data, os);
}